

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::FixupOutPolygon(Clipper *this,OutRec *outrec)

{
  IntPoint *pIVar1;
  IntPoint *pIVar2;
  IntPoint *pIVar3;
  bool bVar4;
  code cVar5;
  OutPt *pOVar6;
  long lVar7;
  IntPoint pt2;
  IntPoint pt3;
  IntPoint pt1;
  bool bVar8;
  OutPt *pOVar9;
  OutPt *pOVar10;
  OutPt *pOVar11;
  OutPt *local_38;
  
  outrec->BottomPt = (OutPt *)0x0;
  pOVar10 = outrec->Pts;
  bVar4 = this->m_StrictSimple;
  cVar5 = (this->_vptr_Clipper[-3] + 0x10)
          [(long)&(this->m_IntersectList).
                  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
          ];
  do {
    pOVar9 = (OutPt *)0x0;
LAB_0027ba52:
    pOVar11 = pOVar10;
    pOVar6 = pOVar11->Prev;
    if ((pOVar6 == pOVar11) || (pOVar10 = pOVar11->Next, pOVar6 == pOVar10)) {
      local_38 = pOVar11;
      DisposeOutPts(&local_38);
      pOVar11 = (OutPt *)0x0;
LAB_0027bb6e:
      outrec->Pts = pOVar11;
      return;
    }
    pIVar1 = &pOVar11->Pt;
    lVar7 = (pOVar11->Pt).Y;
    pt2 = *pIVar1;
    pIVar2 = &pOVar10->Pt;
    pt3 = *pIVar2;
    if (lVar7 != (pOVar10->Pt).Y || pIVar1->X != pIVar2->X) {
      pIVar3 = &pOVar6->Pt;
      pt1 = *pIVar3;
      if ((lVar7 == (pOVar6->Pt).Y && pIVar1->X == pIVar3->X) ||
         ((bVar8 = SlopesEqual(*pIVar3,*pIVar1,*pIVar2,
                               (bool)(this->_vptr_Clipper[-3] + 8)
                                     [(long)&(this->m_GhostJoins).
                                             super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                     ]), bVar8 &&
          ((((bVar4 | (byte)cVar5) & 1) == 0 || (bVar8 = Pt2IsBetweenPt1AndPt3(pt1,pt2,pt3), !bVar8)
           ))))) goto LAB_0027bb3a;
      if (pOVar11 == pOVar9) goto LAB_0027bb6e;
      if (pOVar9 == (OutPt *)0x0) {
        pOVar9 = pOVar11;
      }
      goto LAB_0027ba52;
    }
LAB_0027bb3a:
    pOVar6->Next = pOVar10;
    pOVar11->Next->Prev = pOVar6;
    pOVar10 = pOVar11->Prev;
    operator_delete(pOVar11,0x28);
  } while( true );
}

Assistant:

void Clipper::FixupOutPolygon(OutRec &outrec)
{
    //FixupOutPolygon() - removes duplicate points and simplifies consecutive
    //parallel edges by removing the middle vertex.
    OutPt *lastOK = 0;
    outrec.BottomPt = 0;
    OutPt *pp = outrec.Pts;
    bool preserveCol = m_PreserveCollinear || m_StrictSimple;

    for (;;)
    {
        if (pp->Prev == pp || pp->Prev == pp->Next)
        {
            DisposeOutPts(pp);
            outrec.Pts = 0;
            return;
        }

        //test for duplicate points and collinear edges ...
        if ((pp->Pt == pp->Next->Pt) || (pp->Pt == pp->Prev->Pt) ||
            (SlopesEqual(pp->Prev->Pt, pp->Pt, pp->Next->Pt, m_UseFullRange) &&
            (!preserveCol || !Pt2IsBetweenPt1AndPt3(pp->Prev->Pt, pp->Pt, pp->Next->Pt))))
        {
            lastOK = 0;
            OutPt *tmp = pp;
            pp->Prev->Next = pp->Next;
            pp->Next->Prev = pp->Prev;
            pp = pp->Prev;
            delete tmp;
        }
        else if (pp == lastOK) break;
        else
        {
            if (!lastOK) lastOK = pp;
            pp = pp->Next;
        }
    }
    outrec.Pts = pp;
}